

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Marray<float,_std::allocator<unsigned_long>_>::Marray
          (Marray<float,_std::allocator<unsigned_long>_> *this,
          Marray<float,_std::allocator<unsigned_long>_> *in)

{
  pointer __dest;
  pointer __src;
  size_t sVar1;
  float *pfVar2;
  allocator<float> local_19;
  View<float,_false,_std::allocator<unsigned_long>_> *local_18;
  Marray<float,_std::allocator<unsigned_long>_> *in_local;
  Marray<float,_std::allocator<unsigned_long>_> *this_local;
  
  local_18 = &in->super_View<float,_false,_std::allocator<unsigned_long>_>;
  in_local = this;
  std::allocator<float>::allocator(&local_19);
  View<float,_false,_std::allocator<unsigned_long>_>::View
            (&this->super_View<float,_false,_std::allocator<unsigned_long>_>,&local_19);
  std::allocator<float>::~allocator(&local_19);
  std::allocator<float>::allocator
            ((allocator<float> *)&this->field_0x40,(allocator<float> *)(local_18 + 1));
  testInvariant((Marray<float,_std::allocator<unsigned_long>_> *)local_18);
  if (local_18->data_ == (pointer)0x0) {
    (this->super_View<float,_false,_std::allocator<unsigned_long>_>).data_ = (pointer)0x0;
  }
  else {
    sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::size(local_18);
    pfVar2 = __gnu_cxx::new_allocator<float>::allocate
                       ((new_allocator<float> *)&this->field_0x40,sVar1,(void *)0x0);
    (this->super_View<float,_false,_std::allocator<unsigned_long>_>).data_ = pfVar2;
    __dest = (this->super_View<float,_false,_std::allocator<unsigned_long>_>).data_;
    __src = local_18->data_;
    sVar1 = View<float,_false,_std::allocator<unsigned_long>_>::size(local_18);
    memcpy(__dest,__src,sVar1 << 2);
  }
  marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
            (&(this->super_View<float,_false,_std::allocator<unsigned_long>_>).geometry_,
             &local_18->geometry_);
  testInvariant(this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const Marray<T, A>& in
)
:   dataAllocator_(in.dataAllocator_) 
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }
    if(in.data_ == 0) {
        this->data_ = 0;
    }
    else {
        this->data_ = dataAllocator_.allocate(in.size());
        memcpy(this->data_, in.data_, (in.size())*sizeof(T));
    }
    this->geometry_ = in.geometry_;
    testInvariant();
}